

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O0

void __thiscall MemMat<int>::MemMat(MemMat<int> *this,Mat_<int> *img)

{
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  undefined8 in_R9;
  Mat_<int> *this_00;
  Mat1i *this_01;
  int local_f4;
  Size local_f0;
  Mat_<int> local_e8;
  Mat_<int> local_78;
  Mat_<int> *local_18;
  Mat_<int> *img_local;
  MemMat<int> *this_local;
  
  this_00 = &this->img_;
  local_18 = img;
  img_local = (Mat_<int> *)this;
  cv::Mat_<int>::Mat_(this_00);
  this_01 = &this->accesses_;
  cv::Mat_<int>::Mat_(this_01);
  cv::Mat_<int>::clone(&local_78,(__fn *)img,__child_stack,in_ECX,in_R8,in_R9,this_00,this,this_01);
  cv::Mat_<int>::operator=(&this->img_,&local_78);
  cv::Mat_<int>::~Mat_(&local_78);
  cv::MatSize::operator()((MatSize *)&local_f0);
  local_f4 = 0;
  cv::Mat_<int>::Mat_(&local_e8,&local_f0,&local_f4);
  cv::Mat_<int>::operator=(&this->accesses_,&local_e8);
  cv::Mat_<int>::~Mat_(&local_e8);
  this->rows = *(int *)&img->field_0x8;
  this->cols = *(int *)&img->field_0xc;
  return;
}

Assistant:

MemMat(cv::Mat_<T> img)
    {
        img_ = img.clone(); // Deep copy
        accesses_ = cv::Mat1i(img.size(), 0);
        rows = img.rows;
        cols = img.cols;
    }